

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteCommonCodeRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  cmGeneratedFileStream *this_01;
  char *pcVar4;
  string dependFileNameFull;
  cmGeneratedFileStream depFileStream;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string
            ((string *)&depFileStream,"CMAKE_MAKE_INCLUDE_FROM_ROOT",
             (allocator *)&dependFileNameFull);
  bVar1 = cmMakefile::IsOn(this_00,(string *)&depFileStream);
  pcVar4 = "";
  if (bVar1) {
    pcVar4 = "$(CMAKE_BINARY_DIR)/";
  }
  std::__cxx11::string::~string((string *)&depFileStream);
  std::__cxx11::string::string
            ((string *)&dependFileNameFull,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::append((char *)&dependFileNameFull);
  poVar2 = std::operator<<((ostream *)this->BuildFileStream,
                           "# Include any dependencies generated for this target.\n");
  poVar2 = std::operator<<(poVar2,(string *)&this->GlobalGenerator->IncludeDirective);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,pcVar4);
  cmCommonTargetGenerator::Convert
            ((string *)&depFileStream,&this->super_cmCommonTargetGenerator,&dependFileNameFull,
             HOME_OUTPUT,MAKERULE);
  poVar2 = std::operator<<(poVar2,(string *)&depFileStream);
  std::operator<<(poVar2,"\n\n");
  std::__cxx11::string::~string((string *)&depFileStream);
  if (this->NoRuleMessages == false) {
    poVar2 = std::operator<<((ostream *)this->BuildFileStream,
                             "# Include the progress variables for this target.\n");
    poVar2 = std::operator<<(poVar2,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,pcVar4);
    cmCommonTargetGenerator::Convert
              ((string *)&depFileStream,&this->super_cmCommonTargetGenerator,
               &this->ProgressFileNameFull,HOME_OUTPUT,MAKERULE);
    poVar2 = std::operator<<(poVar2,(string *)&depFileStream);
    std::operator<<(poVar2,"\n\n");
    std::__cxx11::string::~string((string *)&depFileStream);
  }
  bVar1 = cmsys::SystemTools::FileExists(dependFileNameFull._M_dataplus._M_p);
  if (!bVar1) {
    cmGeneratedFileStream::cmGeneratedFileStream
              (&depFileStream,dependFileNameFull._M_dataplus._M_p,false);
    poVar2 = std::operator<<((ostream *)&depFileStream,"# Empty dependencies file for ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(poVar2,"# This may be replaced when dependencies are built.");
    std::endl<char,std::char_traits<char>>(poVar2);
    cmGeneratedFileStream::~cmGeneratedFileStream(&depFileStream);
  }
  psVar3 = &this->FlagFileNameFull;
  std::__cxx11::string::_M_assign((string *)psVar3);
  std::__cxx11::string::append((char *)psVar3);
  this_01 = (cmGeneratedFileStream *)operator_new(0x248);
  cmGeneratedFileStream::cmGeneratedFileStream(this_01,(psVar3->_M_dataplus)._M_p,false);
  this->FlagFileStream = this_01;
  cmGeneratedFileStream::SetCopyIfDifferent(this_01,true);
  if (this->FlagFileStream != (cmGeneratedFileStream *)0x0) {
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,(ostream *)this->FlagFileStream);
    poVar2 = std::operator<<((ostream *)this->BuildFileStream,
                             "# Include the compile flags for this target\'s objects.\n");
    poVar2 = std::operator<<(poVar2,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,pcVar4);
    cmCommonTargetGenerator::Convert
              ((string *)&depFileStream,&this->super_cmCommonTargetGenerator,psVar3,HOME_OUTPUT,
               MAKERULE);
    poVar2 = std::operator<<(poVar2,(string *)&depFileStream);
    std::operator<<(poVar2,"\n\n");
    std::__cxx11::string::~string((string *)&depFileStream);
  }
  std::__cxx11::string::~string((string *)&dependFileNameFull);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteCommonCodeRules()
{
  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")?
                      "$(CMAKE_BINARY_DIR)/" : "");

  // Include the dependencies for the target.
  std::string dependFileNameFull = this->TargetBuildDirectoryFull;
  dependFileNameFull += "/depend.make";
  *this->BuildFileStream
    << "# Include any dependencies generated for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << this->Convert(dependFileNameFull,
                     cmLocalGenerator::HOME_OUTPUT,
                     cmLocalGenerator::MAKERULE)
    << "\n\n";

  if(!this->NoRuleMessages)
    {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << this->Convert(this->ProgressFileNameFull,
                       cmLocalGenerator::HOME_OUTPUT,
                       cmLocalGenerator::MAKERULE)
      << "\n\n";
    }

  // make sure the depend file exists
  if (!cmSystemTools::FileExists(dependFileNameFull.c_str()))
    {
    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(dependFileNameFull.c_str());
    depFileStream
      << "# Empty dependencies file for "
      << this->GeneratorTarget->GetName() << ".\n"
      << "# This may be replaced when dependencies are built." << std::endl;
    }

  // Open the flags file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->FlagFileNameFull = this->TargetBuildDirectoryFull;
  this->FlagFileNameFull += "/flags.make";
  this->FlagFileStream =
    new cmGeneratedFileStream(this->FlagFileNameFull.c_str());
  this->FlagFileStream->SetCopyIfDifferent(true);
  if(!this->FlagFileStream)
    {
    return;
    }
  this->LocalGenerator->WriteDisclaimer(*this->FlagFileStream);

  // Include the flags for the target.
  *this->BuildFileStream
    << "# Include the compile flags for this target's objects.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << this->Convert(this->FlagFileNameFull,
                                     cmLocalGenerator::HOME_OUTPUT,
                                     cmLocalGenerator::MAKERULE)
    << "\n\n";
}